

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O2

uint64_t mulmod(uint64_t a,uint64_t b,uint64_t q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = b;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a;
  uVar3 = __umodti3(SUB168(auVar1 * auVar2,0),SUB168(auVar1 * auVar2,8),q,0);
  return uVar3;
}

Assistant:

uint64_t mulmod(uint64_t a, uint64_t b, uint64_t q) {

    #ifdef __SIZEOF_INT128__

        // make use of the inofficial but efficient 128-bit integer type
        unsigned __int128 tmp = (unsigned __int128) a * (unsigned __int128) b;
        return (uint64_t) (tmp % q);

    #else

        // this is a rather inefficient fallback implementation
        // in case that there is no 128-bit integer type available
        // attention: this only works with q < 2^63 due to possible overflow problems

        // a = a1 * 2^32 + a2 ; b = b1 * 2^32 + b2
        uint64_t a1 = a >> 32;
        uint64_t a2 = a & 0x00000000FFFFFFFF;
        uint64_t b1 = b >> 32;
        uint64_t b2 = b & 0x00000000FFFFFFFF;

        uint64_t a1b1 = (a1 * b1) % q;
        uint64_t a1b2 = (a1 * b2) % q;
        uint64_t a2b1 = (a2 * b1) % q;
        uint64_t a2b2 = (a2 * b2) % q;

        for(size_t i = 0; i < 64; i++) {
            if(i < 32) {
                a1b2 <<= 1;
                a1b2 %= q;
                a2b1 <<= 1;
                a2b1 %= q;
            }
            a1b1 <<= 1;
            a1b1 %= q;
        }

        uint64_t tmp = (a1b1 + a1b2) % q;
        tmp = (tmp + a2b1) % q;
        tmp = (tmp + a2b2) % q;

        return tmp;

    #endif

}